

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O3

int xSAT_SolverParseDimacs(FILE *pFile,xSAT_Solver_t **p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  int *piVar8;
  xSAT_Solver_t *s;
  Vec_Int_t *vLits;
  ulong uVar9;
  long lVar10;
  byte *__ptr;
  ushort **ppuVar11;
  byte *local_58;
  byte *local_50;
  xSAT_Solver_t **local_48;
  ushort **local_40;
  xSAT_Solver_t *local_38;
  
  local_48 = p;
  pbVar7 = (byte *)xSAT_FileRead(pFile);
  local_58 = pbVar7;
  local_40 = __ctype_b_loc();
  vLits = (Vec_Int_t *)0x0;
  s = (xSAT_Solver_t *)0x0;
  local_58 = pbVar7;
  ppuVar11 = local_40;
  local_50 = pbVar7;
  local_38 = s;
LAB_00556ef7:
  do {
    __ptr = local_50;
    puVar4 = *ppuVar11;
    pbVar7 = local_58 + -1;
    do {
      local_58 = local_58 + 1;
      bVar1 = pbVar7[1];
      uVar9 = (ulong)(char)bVar1;
      pbVar7 = pbVar7 + 1;
    } while ((*(byte *)((long)puVar4 + uVar9 * 2 + 1) & 0x20) != 0);
    if (bVar1 == 99) {
      while ((char)uVar9 != '\0') {
        if (((uint)uVar9 & 0xff) == 10) goto LAB_00556ef7;
        bVar1 = *local_58;
        local_58 = local_58 + 1;
        uVar9 = (ulong)bVar1;
      }
      local_58 = local_58 + -1;
      goto LAB_00556ef7;
    }
    local_58 = pbVar7;
    if (bVar1 == 0) {
      if (vLits->pArray != (int *)0x0) {
        free(vLits->pArray);
      }
      free(vLits);
      *local_48 = s;
      iVar6 = xSAT_SolverSimplify(s);
      goto LAB_0055716f;
    }
    if (bVar1 == 0x70) {
      do {
        local_58 = pbVar7;
        pbVar7 = local_58 + 1;
      } while ((*(byte *)((long)puVar4 + (long)(char)local_58[1] * 2 + 1) & 0x20) != 0);
      do {
        pbVar7 = local_58 + 1;
        local_58 = local_58 + 1;
      } while ((*(byte *)((long)puVar4 + (long)(char)*pbVar7 * 2 + 1) & 0x20) == 0);
      iVar6 = xSAT_ReadInt((char **)&local_58);
      xSAT_ReadInt((char **)&local_58);
      do {
        bVar1 = *local_58;
        pbVar7 = local_58;
        if (bVar1 == 0) break;
        local_58 = local_58 + 1;
        pbVar7 = local_58;
      } while (bVar1 != 10);
      local_58 = pbVar7;
      s = xSAT_SolverCreate();
      vLits = (Vec_Int_t *)malloc(0x10);
      if (iVar6 - 1U < 0xf) {
        iVar6 = 0x10;
      }
      vLits->nSize = 0;
      vLits->nCap = iVar6;
      if (iVar6 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc((long)iVar6 << 2);
      }
      vLits->pArray = piVar8;
      local_58 = pbVar7;
      local_38 = s;
    }
    else {
      if (s == (xSAT_Solver_t *)0x0) {
        puts("There is no parameter line.");
        exit(1);
      }
      vLits->nSize = 0;
      while (iVar6 = xSAT_ReadInt((char **)&local_58), s = local_38, iVar6 != 0) {
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        uVar2 = vLits->nSize;
        if (uVar2 == vLits->nCap) {
          if ((int)uVar2 < 0x10) {
            if (vLits->pArray == (int *)0x0) {
              piVar8 = (int *)malloc(0x40);
            }
            else {
              piVar8 = (int *)realloc(vLits->pArray,0x40);
            }
            vLits->pArray = piVar8;
            if (piVar8 == (int *)0x0) {
LAB_0055718d:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            vLits->nCap = 0x10;
          }
          else {
            if (vLits->pArray == (int *)0x0) {
              piVar8 = (int *)malloc((ulong)uVar2 * 8);
            }
            else {
              piVar8 = (int *)realloc(vLits->pArray,(ulong)uVar2 * 8);
            }
            vLits->pArray = piVar8;
            if (piVar8 == (int *)0x0) goto LAB_0055718d;
            vLits->nCap = uVar2 * 2;
          }
        }
        else {
          piVar8 = vLits->pArray;
        }
        iVar3 = vLits->nSize;
        vLits->nSize = iVar3 + 1;
        piVar8[iVar3] = (uint)(iVar6 < 1) + iVar5 * 2 + -2;
      }
      iVar6 = xSAT_SolverAddClause(local_38,vLits);
      ppuVar11 = local_40;
      if (iVar6 == 0) {
        iVar6 = 0;
        printf("Vector has %d entries: {",(ulong)(uint)vLits->nSize);
        if (0 < vLits->nSize) {
          lVar10 = 0;
          do {
            printf(" %d",(ulong)(uint)vLits->pArray[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < vLits->nSize);
        }
        puts(" }");
        __ptr = local_50;
LAB_0055716f:
        if (__ptr != (byte *)0x0) {
          free(__ptr);
        }
        return iVar6;
      }
    }
  } while( true );
}

Assistant:

int xSAT_SolverParseDimacs( FILE * pFile, xSAT_Solver_t ** p )
{
    char * pText;
    int  Value;
    pText = xSAT_FileRead( pFile );
    Value = xSAT_ParseDimacs( pText, p );
    ABC_FREE( pText );
    return Value;
}